

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

ssize_t __thiscall Process::read(Process *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  uint __i;
  int iVar2;
  long lVar3;
  int *piVar4;
  int iVar5;
  timeval tv;
  fd_set fdr;
  
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    fdr.fds_bits[lVar3] = 0;
  }
  uVar1 = *(uint *)__nbytes;
  iVar2 = 0;
  if (((uVar1 & 1) != 0) && (iVar5 = this->fdStdOutRead, iVar2 = 0, iVar5 != 0)) {
    fdr.fds_bits[iVar5 / 0x40] = fdr.fds_bits[iVar5 / 0x40] | 1L << ((byte)iVar5 & 0x3f);
    iVar2 = iVar5;
  }
  if (((((uVar1 & 2) == 0) || (iVar5 = this->fdStdErrRead, iVar5 == 0)) ||
      (fdr.fds_bits[iVar5 / 0x40] = fdr.fds_bits[iVar5 / 0x40] | 1L << ((byte)iVar5 & 0x3f),
      iVar5 <= iVar2)) && (iVar5 = iVar2, iVar2 == 0)) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
  }
  else {
    tv.tv_sec = 1000;
    tv.tv_usec = 0;
    do {
      iVar2 = select(iVar5 + 1,(fd_set *)&fdr,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&tv);
    } while (iVar2 == 0);
  }
  return -1;
}

Assistant:

ssize Process::read(void* buffer, usize length, uint& streams)
{
#ifdef _WIN32
  HANDLE handles[2];
  DWORD handleCount = 0;
  if(streams & stdoutStream && hStdOutRead != INVALID_HANDLE_VALUE)
    handles[handleCount++] = hStdOutRead;
  if(streams & stderrStream && hStdErrRead != INVALID_HANDLE_VALUE)
    handles[handleCount++] = hStdErrRead;
  if(handleCount == 0)
  {
    SetLastError(ERROR_INVALID_HANDLE);
    return -1;
  }
  DWORD dw = WaitForMultipleObjects(handleCount, handles, FALSE, INFINITE);
  if(dw < WAIT_OBJECT_0 || dw >= WAIT_OBJECT_0 + handleCount)
    return -1;
  HANDLE readHandle = handles[dw - WAIT_OBJECT_0];
  streams = readHandle == hStdOutRead ? stdoutStream : stderrStream;
  DWORD i;
#ifdef _AMD64
  byte* bufferStart = (byte*)buffer;
  while(length > (usize)INT_MAX)
  {
    if(!ReadFile(readHandle, buffer, INT_MAX, &i, NULL))
    {
      if(GetLastError() == ERROR_BROKEN_PIPE)
        return (byte*)buffer - bufferStart;
      return -1;
    }
    buffer = (byte*)buffer + i;
    if(i != INT_MAX)
      return (byte*)buffer - bufferStart;
    length -= INT_MAX;
  }
  if(!ReadFile(readHandle, buffer, (DWORD)length, &i, NULL))
  {
    if(GetLastError() == ERROR_BROKEN_PIPE)
      return (byte*)buffer - bufferStart;
    return -1;
  }
  buffer = (byte*)buffer + i;
  return (byte*)buffer - bufferStart;
#else
  if(!ReadFile(readHandle, buffer, length, &i, NULL))
    return -1;
  return i;
#endif
#else
  fd_set fdr;
  FD_ZERO(&fdr);
  int maxFd = 0;
  if(streams & stdoutStream && fdStdOutRead)
  {
    FD_SET(fdStdOutRead, &fdr);
    maxFd = fdStdOutRead;
  }
  if(streams & stderrStream && fdStdErrRead)
  {
    FD_SET(fdStdErrRead, &fdr);
    if(fdStdErrRead > maxFd)
      maxFd = fdStdErrRead;
  }
  if(maxFd == 0)
  {
    errno = EINVAL;
    return -1;
  }
  timeval tv = {1000, 0};
  for(;;)
  {
    int i;
    if((i = select(maxFd + 1, &fdr, 0, 0, &tv)) != 0)
      return -1;
    if(i == 0 || (i < 0 && errno == EINTR))
      continue;
  }
  if(streams & stdoutStream && fdStdOutRead && FD_ISSET(fdStdOutRead, &fdr))
  {
    streams = stdoutStream;
    return ::read(fdStdOutRead, buffer, length);
  }
  if(streams & stderrStream && fdStdErrRead && FD_ISSET(fdStdErrRead, &fdr))
  {
    streams = stderrStream;
    return ::read(fdStdErrRead, buffer, length);
  }
  return -1;
#endif
}